

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

string * vkt::shaderexecutor::anon_unknown_0::generatePassthroughFragmentShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,bool useIntOutputs,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *outLocationMap,string *inputPrefix,string *outputPrefix)

{
  bool bVar1;
  DataType DVar2;
  ulong uVar3;
  ostream *poVar4;
  pointer pSVar5;
  pointer __rhs;
  DataType local_2dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  DeclareVariable local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  DeclareVariable local_230;
  undefined1 local_1f0 [8];
  VarType intType;
  DataType intBaseType;
  int vecSize;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_1c8;
  const_iterator output;
  int locationNumber;
  ostringstream local_1b0 [8];
  ostringstream src;
  string *outputPrefix_local;
  string *inputPrefix_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *outLocationMap_local;
  bool useIntOutputs_local;
  ShaderSpec *shaderSpec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  std::operator<<((ostream *)local_1b0,"#version 310 es\n");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_1b0,(string *)&shaderSpec->globalDeclarations);
    std::operator<<(poVar4,"\n");
  }
  output._M_current._0_4_ = 0;
  local_1c8._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (&shaderSpec->outputs);
  while( true ) {
    _intBaseType = std::
                   vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                   ::end(&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1c8,
                       (__normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
                        *)&intBaseType);
    if (!bVar1) break;
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_1c8);
    DVar2 = glu::VarType::getBasicType(&pSVar5->varType);
    bVar1 = glu::isDataTypeBoolOrBVec(DVar2);
    if (bVar1) {
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_1c8);
      DVar2 = glu::VarType::getBasicType(&pSVar5->varType);
      intType.m_data._12_4_ = glu::getDataTypeScalarSize(DVar2);
      if ((int)intType.m_data._12_4_ < 2) {
        local_2dc = TYPE_INT;
      }
      else {
        local_2dc = glu::getDataTypeIntVec(intType.m_data._12_4_);
      }
      intType.m_data.array.size = local_2dc;
      glu::VarType::VarType((VarType *)local_1f0,local_2dc,PRECISION_HIGHP);
      poVar4 = std::operator<<((ostream *)local_1b0,"layout(location = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)output._M_current);
      poVar4 = std::operator<<(poVar4,") flat in ");
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_1c8);
      std::operator+(&local_250,inputPrefix,&pSVar5->name);
      glu::declare(&local_230,(VarType *)local_1f0,&local_250,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_230);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      glu::VarType::~VarType((VarType *)local_1f0);
    }
    else {
      poVar4 = std::operator<<((ostream *)local_1b0,"layout(location = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)output._M_current);
      poVar4 = std::operator<<(poVar4,") flat in ");
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_1c8);
      __rhs = __gnu_cxx::
              __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
              ::operator->(&local_1c8);
      std::operator+(&local_2b0,inputPrefix,&__rhs->name);
      glu::declare(&local_290,&pSVar5->varType,&local_2b0,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_290);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_1c8);
    output._M_current._0_4_ = (int)output._M_current + 1;
  }
  generateFragShaderOutputDecl
            ((ostream *)local_1b0,shaderSpec,useIntOutputs,outLocationMap,outputPrefix);
  std::operator<<((ostream *)local_1b0,"\nvoid main (void)\n{\n");
  generateFragShaderOutAssign
            ((ostream *)local_1b0,shaderSpec,useIntOutputs,inputPrefix,outputPrefix);
  std::operator<<((ostream *)local_1b0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generatePassthroughFragmentShader (const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& inputPrefix, const std::string& outputPrefix)
{
	std::ostringstream	src;

	src <<	"#version 310 es\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	int locationNumber = 0;
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output, ++locationNumber)
	{
		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType		intType		(intBaseType, glu::PRECISION_HIGHP);

			src << "layout(location = " << locationNumber << ") flat in " << glu::declare(intType, inputPrefix + output->name) << ";\n";
		}
		else
			src << "layout(location = " << locationNumber << ") flat in " << glu::declare(output->varType, inputPrefix + output->name) << ";\n";
	}

	generateFragShaderOutputDecl(src, shaderSpec, useIntOutputs, outLocationMap, outputPrefix);

	src << "\nvoid main (void)\n{\n";

	generateFragShaderOutAssign(src, shaderSpec, useIntOutputs, inputPrefix, outputPrefix);

	src << "}\n";

	return src.str();
}